

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

int testMultiFunctionDefaultFunctionName(void)

{
  bool bVar1;
  ResultType RVar2;
  ArenaStringPtr *pAVar3;
  Arena *pAVar4;
  ostream *poVar5;
  Result local_168;
  Result local_140;
  Result local_118;
  FunctionDescription *local_f0;
  FunctionDescription *function;
  undefined4 local_bc;
  Result local_b8;
  ModelDescription *local_90;
  ModelDescription *description;
  ValidationPolicy local_74;
  undefined1 local_70 [4];
  ValidationPolicy validationPolicy;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)local_70);
  CoreML::ValidationPolicy::ValidationPolicy(&local_74);
  local_74.allowsEmptyInput = true;
  local_74.allowsEmptyOutput = true;
  local_74.allowsMultipleFunctions = true;
  local_90 = CoreML::Specification::Model::mutable_description((Model *)local_70);
  pAVar3 = &local_90->defaultfunctionname_;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&local_90->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar3,"foo",pAVar4);
  CoreML::validateModelDescription(&local_b8,local_90,9,&local_74);
  bVar1 = CoreML::Result::good(&local_b8);
  CoreML::Result::~Result(&local_b8);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x130);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,
                             "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                            );
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    CoreML::validateModelDescription((Result *)&function,local_90,9,&local_74);
    RVar2 = CoreML::Result::type((Result *)&function);
    CoreML::Result::~Result((Result *)&function);
    if (RVar2 == INVALID_DEFAULT_FUNCTION_NAME) {
      local_f0 = CoreML::Specification::ModelDescription::add_functions(local_90);
      pAVar3 = &local_f0->name_;
      pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&local_f0->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::
      Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar3,"bar",pAVar4);
      CoreML::validateModelDescription(&local_118,local_90,9,&local_74);
      bVar1 = CoreML::Result::good(&local_118);
      CoreML::Result::~Result(&local_118);
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                );
        poVar5 = std::operator<<(poVar5,":");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x134);
        poVar5 = std::operator<<(poVar5,": error: ");
        poVar5 = std::operator<<(poVar5,
                                 "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
                                );
        poVar5 = std::operator<<(poVar5," was false, expected true.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
      else {
        CoreML::validateModelDescription(&local_140,local_90,9,&local_74);
        RVar2 = CoreML::Result::type(&local_140);
        CoreML::Result::~Result(&local_140);
        if (RVar2 == INVALID_DEFAULT_FUNCTION_NAME) {
          pAVar3 = &local_f0->name_;
          pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation
                             (&local_f0->super_MessageLite);
          google::protobuf::internal::ArenaStringPtr::
          Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar3,"foo",pAVar4);
          CoreML::validateModelDescription(&local_168,local_90,9,&local_74);
          bVar1 = CoreML::Result::good(&local_168);
          CoreML::Result::~Result(&local_168);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            m._oneof_case_[0] = 0;
          }
          else {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                    );
            poVar5 = std::operator<<(poVar5,":");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x137);
            poVar5 = std::operator<<(poVar5,": error: ");
            poVar5 = std::operator<<(poVar5,
                                     "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
                                    );
            poVar5 = std::operator<<(poVar5," was false, expected true.");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            m._oneof_case_[0] = 1;
          }
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x134);
          poVar5 = std::operator<<(poVar5,": error: ");
          poVar5 = std::operator<<(poVar5,
                                   "((ResultType::INVALID_DEFAULT_FUNCTION_NAME)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                                  );
          poVar5 = std::operator<<(poVar5," was false, expected true.");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          m._oneof_case_[0] = 1;
        }
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x130);
      poVar5 = std::operator<<(poVar5,": error: ");
      poVar5 = std::operator<<(poVar5,
                               "((ResultType::INVALID_DEFAULT_FUNCTION_NAME)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
                              );
      poVar5 = std::operator<<(poVar5," was false, expected true.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
  }
  local_bc = 1;
  CoreML::Specification::Model::~Model((Model *)local_70);
  return m._oneof_case_[0];
}

Assistant:

int testMultiFunctionDefaultFunctionName() {
    Specification::Model m;

    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;

    auto *description = m.mutable_description();
    description->set_defaultfunctionname("foo");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_DEFAULT_FUNCTION_NAME);

    auto *function = description->add_functions();
    function->set_name("bar");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_DEFAULT_FUNCTION_NAME);

    function->set_name("foo");
    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    return 0;
}